

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# allreduce_sockets.cc
# Opt level: O2

void __thiscall AllReduceSockets::broadcast(AllReduceSockets *this,char *buffer,size_t n)

{
  int __fd;
  ssize_t sVar1;
  int *piVar2;
  char *pcVar3;
  ostream *poVar4;
  vw_exception *this_00;
  size_t __n;
  size_t sVar5;
  size_t parent_read_pos;
  size_t children_sent_pos;
  ostream *local_1e0;
  string local_1d8;
  stringstream __msg;
  ostream local_1a8;
  
  children_sent_pos = 0;
  parent_read_pos = 0;
  if ((this->socks).parent == -1) {
    parent_read_pos = n;
  }
  sVar5 = 0;
  if (((this->socks).children[0] == -1) && ((this->socks).children[1] == -1)) {
    sVar5 = n;
    children_sent_pos = n;
  }
  while( true ) {
    if (n <= sVar5 && n <= parent_read_pos) {
      return;
    }
    pass_down(this,buffer,parent_read_pos,&children_sent_pos);
    sVar5 = children_sent_pos;
    if (n <= children_sent_pos && n <= parent_read_pos) break;
    __fd = (this->socks).parent;
    if (__fd != -1) {
      __n = n - parent_read_pos;
      if (__n == 0) {
        std::__cxx11::stringstream::stringstream((stringstream *)&__msg);
        std::operator<<(&local_1a8,"I think parent has no data to send but he thinks he has");
        this_00 = (vw_exception *)__cxa_allocate_exception(0x38);
        std::__cxx11::stringbuf::str();
        VW::vw_exception::vw_exception
                  (this_00,
                   "/workspace/llm4binary/github/license_all_cmakelists_1510/LAIRLAB[P]vowpal_wabbit/vowpalwabbit/allreduce_sockets.cc"
                   ,0x11c,&local_1d8);
        __cxa_throw(this_00,&VW::vw_exception::typeinfo,VW::vw_exception::~vw_exception);
      }
      if (0xffff < __n) {
        __n = 0x10000;
      }
      sVar1 = recv(__fd,buffer + parent_read_pos,__n,0);
      if ((int)sVar1 == -1) {
        local_1e0 = std::operator<<((ostream *)&std::cerr," recv from parent: ");
        piVar2 = __errno_location();
        pcVar3 = strerror(*piVar2);
        poVar4 = std::operator<<(local_1e0,pcVar3);
        std::endl<char,std::char_traits<char>>(poVar4);
      }
      parent_read_pos = parent_read_pos + (long)(int)sVar1;
    }
  }
  return;
}

Assistant:

void AllReduceSockets::broadcast(char* buffer, const size_t n)
{
  size_t parent_read_pos = 0;    // First unread float from parent
  size_t children_sent_pos = 0;  // First unsent float to children
  // parent_sent_pos <= left_read_pos
  // parent_sent_pos <= right_read_pos

  if (socks.parent == -1)
  {
    parent_read_pos = n;
  }
  if (socks.children[0] == -1 && socks.children[1] == -1)
    children_sent_pos = n;

  while (parent_read_pos < n || children_sent_pos < n)
  {
    pass_down(buffer, parent_read_pos, children_sent_pos);
    if (parent_read_pos >= n && children_sent_pos >= n)
      break;

    if (socks.parent != -1)
    {
      // there is data to be read from the parent
      if (parent_read_pos == n)
        THROW("I think parent has no data to send but he thinks he has");

      size_t count = min(ar_buf_size, n - parent_read_pos);
      int read_size = recv(socks.parent, buffer + parent_read_pos, (int)count, 0);
      if (read_size == -1)
      {
        cerr << " recv from parent: " << strerror(errno) << endl;
      }
      parent_read_pos += read_size;
    }
  }
}